

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.cpp
# Opt level: O2

bool __thiscall grammar::using_symbol(grammar *this,symbol_t *symbol)

{
  bool bVar1;
  _Rb_tree_header *p_Var2;
  _Base_ptr p_Var3;
  _Rb_tree_node_base *p_Var4;
  
  p_Var3 = (this->symbols)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(this->symbols)._M_t._M_impl.super__Rb_tree_header;
  while ((p_Var4 = &p_Var2->_M_header, (_Rb_tree_header *)p_Var3 != p_Var2 &&
         (bVar1 = operator==((this_t *)&p_Var3[1]._M_parent,symbol), p_Var4 = p_Var3, !bVar1))) {
    p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
  }
  return (_Rb_tree_header *)p_Var4 != p_Var2;
}

Assistant:

bool grammar::using_symbol(const symbol_t & symbol) const {
    return std::find_if(
               symbols.begin(), symbols.end(),
               [&symbol](const auto & entry) { return entry.second == symbol; })
           != symbols.end();
}